

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitStructStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,StructStmt *stmt)

{
  pointer pFVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  pointer pFVar4;
  string *psVar5;
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  psVar5 = &this->m_ident;
  poVar3 = std::operator<<(local_1a8,(string *)psVar5);
  poVar3 = std::operator<<(poVar3,"(Stmt::Struct ");
  poVar3 = std::operator<<(poVar3,(string *)&(stmt->name).lexeme);
  std::operator<<(poVar3," (");
  std::operator<<(local_1a8,") (\n");
  std::__cxx11::string::append((char *)psVar5);
  pFVar1 = (stmt->fields).
           super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pFVar4 = (stmt->fields).
                super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar4 != pFVar1; pFVar4 = pFVar4 + 1) {
    poVar3 = std::operator<<(local_1a8,(string *)psVar5);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = std::operator<<(poVar3,(string *)&(pFVar4->name).lexeme);
    poVar3 = std::operator<<(poVar3," ");
    iVar2 = (*((pFVar4->typename_)._M_t.
               super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
               .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename
              [4])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    std::operator<<(poVar3,")\n");
  }
  std::__cxx11::string::erase((ulong)psVar5,0);
  std::operator<<(local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitStructStmt(StructStmt &stmt) {
        std::stringstream s;
        s << m_ident << "(Stmt::Struct " << stmt.name.lexeme << " (";

        s << ") (\n";
        m_ident += "    ";

        for (auto &field : stmt.fields) {
            s << m_ident << "(" << field.name.lexeme << " " << field.typename_->name() << ")\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }